

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFieldsToString
          (Printer *this,UnknownFieldSet *unknown_fields,string *output)

{
  bool bVar1;
  string_view str;
  StringOutputStream output_stream;
  LogMessage LStack_28;
  
  if (output != (string *)0x0) {
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
    io::StringOutputStream::StringOutputStream((StringOutputStream *)&LStack_28,output);
    bVar1 = PrintUnknownFields(this,unknown_fields,(ZeroCopyOutputStream *)&LStack_28);
    return bVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
             ,0x8ba,"output");
  str._M_str = "output specified is nullptr";
  str._M_len = 0x1b;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_28,str);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

bool TextFormat::Printer::PrintUnknownFieldsToString(
    const UnknownFieldSet& unknown_fields, std::string* output) const {
  ABSL_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);
  return PrintUnknownFields(unknown_fields, &output_stream);
}